

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void * text_delete_new(t_symbol *s,int argc,t_atom *argv)

{
  t_text_client *x_00;
  t_text_delete *x;
  t_atom *argv_local;
  t_symbol *ptStack_10;
  int argc_local;
  t_symbol *s_local;
  
  x = (t_text_delete *)argv;
  argv_local._4_4_ = argc;
  ptStack_10 = s;
  x_00 = (t_text_client *)pd_new(text_delete_class);
  text_client_argparse(x_00,(int *)((long)&argv_local + 4),(t_atom **)&x,"text delete");
  if (argv_local._4_4_ != 0) {
    post("warning: text delete ignoring extra argument: ");
    postatom(argv_local._4_4_,(t_atom *)x);
    endpost();
  }
  if (x_00->tc_struct == (t_symbol *)0x0) {
    symbolinlet_new((t_object *)x_00,&x_00->tc_sym);
  }
  else {
    pointerinlet_new((t_object *)x_00,&x_00->tc_gp);
  }
  return x_00;
}

Assistant:

static void *text_delete_new(t_symbol *s, int argc, t_atom *argv)
{
    t_text_delete *x = (t_text_delete *)pd_new(text_delete_class);
    text_client_argparse(&x->x_tc, &argc, &argv, "text delete");
    if (argc)
    {
        post("warning: text delete ignoring extra argument: ");
        postatom(argc, argv); endpost();
    }
    if (x->x_struct)
        pointerinlet_new(&x->x_obj, &x->x_gp);
    else symbolinlet_new(&x->x_obj, &x->x_tc.tc_sym);
    return (x);
}